

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O3

void __thiscall
TEST_MinipointCounterTest_RoundWindPair_Test::~TEST_MinipointCounterTest_RoundWindPair_Test
          (TEST_MinipointCounterTest_RoundWindPair_Test *this)

{
  pointer mem;
  
  (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMinipointCounterTest_001dace0;
  mem = (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).h.tiles.
        super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
        super__Vector_impl_data._M_start;
  if (mem != (pointer)0x0) {
    operator_delete(mem,(long)(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).h.tiles.
                              super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage - (long)mem);
  }
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector
            (&(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).h.melds);
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            (&(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).h.pairs);
  std::
  _Rb_tree<mahjong::Tile,_mahjong::Tile,_std::_Identity<mahjong::Tile>,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>
  ::~_Rb_tree(&(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).s.bonus_tiles._M_t);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

TEST(MinipointCounterTest, RoundWindPair)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::SouthWind);

	addPair(Tile::EastWind);
	addOpenNoPointsHandWithoutPair();
	s.winByDiscard();

	CHECK_EQUAL(22, m.total(false));
}